

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

substr __thiscall
c4::yml::Parser::_scan_plain_scalar_blck
          (Parser *this,csubstr currscalar,csubstr peeked_line,size_t indentation)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  ulong uVar6;
  bool bVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  Parser *this_00;
  bool bVar16;
  ro_substr chars;
  ro_substr chars_00;
  ro_substr chars_01;
  substr sVar17;
  basic_substring<const_char> bVar18;
  csubstr cVar19;
  basic_substring<char> bVar20;
  char msg [43];
  csubstr local_158;
  Parser *local_140;
  basic_substring<const_char> local_138;
  char acStack_128 [48];
  ulong local_f8;
  char *local_f0;
  size_t local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  basic_substring<char> local_40;
  
  sVar10 = currscalar.len;
  pcVar13 = currscalar.str;
  sVar8 = (this->m_buf).len;
  local_158 = peeked_line;
  if (sVar8 == 0) {
    if (sVar10 == 0) {
      pcVar11 = (this->m_buf).str;
      bVar7 = pcVar11 == pcVar13;
      bVar16 = pcVar11 != (char *)0x0;
      pcVar11 = pcVar13;
      goto LAB_001df829;
    }
  }
  else {
    pcVar11 = (this->m_buf).str;
    bVar7 = pcVar11 <= pcVar13;
    bVar16 = pcVar13 + sVar10 <= pcVar11 + sVar8;
LAB_001df829:
    if ((bool)(bVar7 & bVar16)) goto LAB_001df8e5;
  }
  builtin_strncpy(acStack_128 + 0x10,"rrscalar))",0xb);
  builtin_strncpy(acStack_128,"_buf.is_super(cu",0x10);
  local_138.len._0_1_ = 'i';
  local_138.len._1_1_ = 'l';
  local_138.len._2_1_ = 'e';
  local_138.len._3_1_ = 'd';
  local_138.len._4_1_ = ':';
  local_138.len._5_1_ = ' ';
  local_138.len._6_1_ = '(';
  local_138.len._7_1_ = 'm';
  local_138.str = (char *)0x6166206b63656863;
  if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
    pcVar1 = (code *)swi(3);
    sVar17 = (substr)(*pcVar1)();
    return sVar17;
  }
  local_68 = 0;
  uStack_60 = 0x7586;
  local_58 = 0;
  pcStack_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_48 = 0x65;
  LVar2.super_LineCol.col = 0;
  LVar2.super_LineCol.offset = SUB168(ZEXT816(0x7586) << 0x40,0);
  LVar2.super_LineCol.line = SUB168(ZEXT816(0x7586) << 0x40,8);
  LVar2.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar2.name.len = 0x65;
  (*(this->m_stack).m_callbacks.m_error)
            ((char *)&local_138,0x2b,LVar2,(this->m_stack).m_callbacks.m_user_data);
  pcVar11 = (this->m_buf).str;
LAB_001df8e5:
  if (pcVar13 + sVar10 < pcVar11) {
    builtin_strncpy(acStack_128,"urrscalar.end() >= m_buf.begin())",0x22);
    local_138.len._0_1_ = 'i';
    local_138.len._1_1_ = 'l';
    local_138.len._2_1_ = 'e';
    local_138.len._3_1_ = 'd';
    local_138.len._4_1_ = ':';
    local_138.len._5_1_ = ' ';
    local_138.len._6_1_ = '(';
    local_138.len._7_1_ = 'c';
    local_138.str = (char *)0x6166206b63656863;
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar1 = (code *)swi(3);
      sVar17 = (substr)(*pcVar1)();
      return sVar17;
    }
    local_90 = 0;
    uStack_88 = 0x7589;
    local_80 = 0;
    pcStack_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_70 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7589) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7589) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_138,0x32,LVar3,(this->m_stack).m_callbacks.m_user_data);
    pcVar11 = (this->m_buf).str;
  }
  if (local_158.len < indentation) {
LAB_001df9bb:
    builtin_strncpy(acStack_128 + 0x20,"ntation))",10);
    builtin_strncpy(acStack_128 + 0x10,"s_with(\' \', inde",0x10);
    builtin_strncpy(acStack_128,"eeked_line.begin",0x10);
    local_138.len._0_1_ = 'i';
    local_138.len._1_1_ = 'l';
    local_138.len._2_1_ = 'e';
    local_138.len._3_1_ = 'd';
    local_138.len._4_1_ = ':';
    local_138.len._5_1_ = ' ';
    local_138.len._6_1_ = '(';
    local_138.len._7_1_ = 'p';
    local_138.str = (char *)0x6166206b63656863;
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar1 = (code *)swi(3);
      sVar17 = (substr)(*pcVar1)();
      return sVar17;
    }
    local_b8 = 0;
    uStack_b0 = 0x758b;
    local_a8 = 0;
    pcStack_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_98 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x758b) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x758b) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_138,0x3a,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  else if (indentation != 0) {
    sVar8 = 0;
    do {
      if (local_158.str[sVar8] != ' ') goto LAB_001df9bb;
      sVar8 = sVar8 + 1;
    } while (indentation != sVar8);
  }
  local_f8 = (long)(pcVar13 + sVar10) - (long)pcVar11;
  local_140 = this;
  local_f0 = pcVar13;
  local_e8 = sVar10;
LAB_001dfacc:
  if (2 < local_158.len) {
    lVar15 = 0;
    while (local_158.str[lVar15] == "\t..."[lVar15 + 1]) {
      lVar15 = lVar15 + 1;
      if (lVar15 == 3) goto LAB_001dfe0f;
    }
    lVar15 = 0;
    while (local_158.str[lVar15] == "---"[lVar15]) {
      lVar15 = lVar15 + 1;
      if (lVar15 == 3) goto LAB_001dfe0f;
    }
  }
  if (local_158.len < indentation) {
LAB_001dfae4:
    chars.len = 4;
    chars.str = " \r\n\t";
    local_138 = basic_substring<const_char>::triml(&local_158,chars);
    chars_00.len = 4;
    chars_00.str = " \r\n\t";
    bVar18 = basic_substring<const_char>::trimr(&local_138,chars_00);
    if (bVar18.str != (char *)0x0 && bVar18.len != 0) {
LAB_001dfe0f:
      sVar8 = local_e8;
      pcVar13 = local_f0;
      uVar6 = local_f8;
      uVar9 = (this->m_state->pos).super_LineCol.offset;
      if (uVar9 < local_f8) {
        builtin_strncpy(acStack_128 + 0x10,"et >= offs)",0xc);
        builtin_strncpy(acStack_128,"_state->pos.offs",0x10);
        local_138.len._0_1_ = 'i';
        local_138.len._1_1_ = 'l';
        local_138.len._2_1_ = 'e';
        local_138.len._3_1_ = 'd';
        local_138.len._4_1_ = ':';
        local_138.len._5_1_ = ' ';
        local_138.len._6_1_ = '(';
        local_138.len._7_1_ = 'm';
        local_138.str = (char *)0x6166206b63656863;
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar1 = (code *)swi(3);
          sVar17 = (substr)(*pcVar1)();
          return sVar17;
        }
        local_e0 = 0;
        uStack_d8 = 0x75c2;
        local_d0 = 0;
        pcStack_c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_c0 = 0x65;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x75c2) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x75c2) << 0x40,8);
        LVar5.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar5.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_138,0x2c,LVar5,(this->m_stack).m_callbacks.m_user_data);
        uVar9 = (this->m_state->pos).super_LineCol.offset;
      }
      basic_substring<char>::basic_substring(&local_40,pcVar13,(sVar8 - uVar6) + uVar9);
      chars_01.len = 3;
      chars_01.str = "\r\n ";
      bVar20 = basic_substring<char>::trimr(&local_40,chars_01);
      sVar17.str = bVar20.str;
      sVar17.len = bVar20.len;
      return sVar17;
    }
    cVar19 = _scan_to_next_nonempty_line(this,indentation);
    sVar8 = cVar19.len;
    if ((sVar8 == 0) || (cVar19.str == (char *)0x0)) goto LAB_001dfe0f;
  }
  else {
    sVar8 = local_158.len;
    cVar19 = local_158;
    if (indentation != 0) {
      sVar10 = 0;
      do {
        if (local_158.str[sVar10] != ' ') goto LAB_001dfae4;
        sVar10 = sVar10 + 1;
      } while (indentation != sVar10);
    }
  }
  local_158 = cVar19;
  uVar9 = sVar8;
  if (1 < sVar8) {
    lVar15 = 0;
    do {
      lVar14 = 0;
      while( true ) {
        if (local_158.len <= (ulong)(lVar14 + lVar15)) {
          _scan_plain_scalar_blck();
        }
        uVar9 = local_158.len;
        if (local_158.str[lVar14 + lVar15] != "\": "[lVar14 + 1]) break;
        lVar14 = lVar14 + 1;
        if (lVar14 == 2) {
          if (lVar15 == -1) goto LAB_001dfc84;
          sVar8 = 0xffffffffffffffff;
          if (local_158.len < 2) goto LAB_001dfd83;
          sVar12 = local_158.len - 2;
          pcVar13 = local_158.str;
          sVar10 = 0;
          goto LAB_001dfc2c;
        }
      }
      bVar7 = lVar15 != sVar8 - 2;
      lVar15 = lVar15 + 1;
    } while (bVar7);
  }
LAB_001dfc84:
  if (uVar9 != 0) {
    if (local_158.str[uVar9 - 1] != ':') {
      if (uVar9 != 1) {
        pcVar13 = local_158.str;
        sVar8 = 0;
        do {
          lVar15 = 0;
          while( true ) {
            if (local_158.len <= lVar15 + sVar8) {
              _scan_plain_scalar_blck();
              pcVar13 = local_138.str;
            }
            this = local_140;
            if (pcVar13[lVar15 + sVar8] != " #"[lVar15]) break;
            lVar15 = lVar15 + 1;
            if (lVar15 == 2) {
              if (sVar8 == 0xffffffffffffffff) goto LAB_001dfdcc;
              _line_progressed(local_140,sVar8);
              goto LAB_001dfe0f;
            }
          }
          bVar7 = sVar8 != uVar9 - 2;
          sVar8 = sVar8 + 1;
        } while (bVar7);
      }
      goto LAB_001dfdcc;
    }
    sVar8 = basic_substring<const_char>::first_of(&local_158,':',0);
    this_00 = local_140;
    _line_progressed(local_140,sVar8);
    bVar7 = is_debugger_attached();
    pcVar13 = "ERROR: lines cannot end with \':\' in plain flow (unquoted) scalars";
    if (bVar7) {
      bVar7 = is_debugger_attached();
      pcVar13 = "ERROR: lines cannot end with \':\' in plain flow (unquoted) scalars";
      if (bVar7) {
        pcVar1 = (code *)swi(3);
        sVar17 = (substr)(*pcVar1)();
        return sVar17;
      }
    }
    goto LAB_001dfdb8;
  }
  goto LAB_001dfdcc;
LAB_001dfc2c:
  do {
    sVar8 = sVar10;
    lVar15 = 0;
    while( true ) {
      if (local_158.len <= lVar15 + sVar8) {
        _scan_plain_scalar_blck();
        pcVar13 = local_138.str;
      }
      if (pcVar13[lVar15 + sVar8] != "\": "[lVar15 + 1]) break;
      lVar15 = lVar15 + 1;
      if (lVar15 == 2) goto LAB_001dfd83;
    }
    sVar10 = sVar8 + 1;
    bVar7 = sVar8 != sVar12;
    sVar8 = 0xffffffffffffffff;
  } while (bVar7);
LAB_001dfd83:
  this_00 = local_140;
  _line_progressed(local_140,sVar8);
  bVar7 = is_debugger_attached();
  pcVar13 = "ERROR: \': \' is not a valid token in plain flow (unquoted) scalars";
  if (bVar7) {
    bVar7 = is_debugger_attached();
    pcVar13 = "ERROR: \': \' is not a valid token in plain flow (unquoted) scalars";
    if (bVar7) {
      pcVar1 = (code *)swi(3);
      sVar17 = (substr)(*pcVar1)();
      return sVar17;
    }
  }
LAB_001dfdb8:
  cVar19.len = 0x41;
  cVar19.str = pcVar13;
  _err<>(this_00,cVar19);
LAB_001dfdcc:
  this = local_140;
  bVar7 = _advance_to_peeked(local_140);
  if (!bVar7) goto LAB_001dfe0f;
  local_158 = (this->m_state->line_contents).rem;
  goto LAB_001dfacc;
}

Assistant:

substr Parser::_scan_plain_scalar_blck(csubstr currscalar, csubstr peeked_line, size_t indentation)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(currscalar));
    // NOTE. there's a problem with _scan_to_next_nonempty_line(), as it counts newlines twice
    // size_t offs = m_state->pos.offset;   // so we workaround by directly counting from the end of the given scalar
    _RYML_CB_ASSERT(m_stack.m_callbacks, currscalar.end() >= m_buf.begin());
    size_t offs = static_cast<size_t>(currscalar.end() - m_buf.begin());
    _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.begins_with(' ', indentation));
    while(true)
    {
        _c4dbgpf("rscalar[IMPL]: continuing... ref_indentation={}", indentation);
        if(peeked_line.begins_with("...") || peeked_line.begins_with("---"))
        {
            _c4dbgpf("rscalar[IMPL]: document termination next -- bail now '{}'", peeked_line.trimr("\r\n"));
            break;
        }
        else if(( ! peeked_line.begins_with(' ', indentation))) // is the line deindented?
        {
            if(!peeked_line.trim(" \r\n\t").empty()) // is the line not blank?
            {
                _c4dbgpf("rscalar[IMPL]: deindented line, not blank -- bail now '{}'", peeked_line.trimr("\r\n"));
                break;
            }
            _c4dbgpf("rscalar[IMPL]: line is blank and has less indentation: ref={} line={}: '{}'", indentation, peeked_line.first_not_of(' ') == csubstr::npos ? 0 : peeked_line.first_not_of(' '), peeked_line.trimr("\r\n"));
            _c4dbgpf("rscalar[IMPL]: ... searching for a line starting at indentation {}", indentation);
            csubstr next_peeked = _scan_to_next_nonempty_line(indentation);
            if(next_peeked.empty())
            {
                _c4dbgp("rscalar[IMPL]: ... finished.");
                break;
            }
            _c4dbgp("rscalar[IMPL]: ... continuing.");
            peeked_line = next_peeked;
        }

        _c4dbgpf("rscalar[IMPL]: line contents: '{}'", peeked_line.right_of(indentation, true).trimr("\r\n"));
        size_t token_pos;
        if(peeked_line.find(": ") != npos)
        {
            _line_progressed(peeked_line.find(": "));
            _c4err("': ' is not a valid token in plain flow (unquoted) scalars");
        }
        else if(peeked_line.ends_with(':'))
        {
            _line_progressed(peeked_line.find(':'));
            _c4err("lines cannot end with ':' in plain flow (unquoted) scalars");
        }
        else if((token_pos = peeked_line.find(" #")) != npos)
        {
            _line_progressed(token_pos);
            break;
            //_c4err("' #' is not a valid token in plain flow (unquoted) scalars");
        }

        _c4dbgpf("rscalar[IMPL]: append another line: (len={})'{}'", peeked_line.len, peeked_line.trimr("\r\n"));
        if(!_advance_to_peeked())
        {
            _c4dbgp("rscalar[IMPL]: file finishes after the scalar");
            break;
        }
        peeked_line = m_state->line_contents.rem;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= offs);
    substr full(m_buf.str + (currscalar.str - m_buf.str),
                currscalar.len + (m_state->pos.offset - offs));
    full = full.trimr("\r\n ");
    return full;
}